

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void anon_unknown.dwarf_d436::getPartNum(int argc,char **argv,int *i,int *j)

{
  invalid_argument *this;
  long lVar1;
  ostream *this_00;
  void *this_01;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  
  if (in_EDI + -2 < *in_RDX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Missing part num with -p option");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar1 = strtol(*(char **)(in_RSI + (long)(*in_RDX + 1) * 8),(char **)0x0,0);
  *in_RCX = (int)lVar1;
  this_00 = std::operator<<((ostream *)&std::cout,"part number: ");
  this_01 = (void *)std::ostream::operator<<(this_00,*in_RCX);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  *in_RDX = *in_RDX + 2;
  return;
}

Assistant:

void
getPartNum (int argc, char** argv, int& i, int* j)
{
    if (i > argc - 2)
        throw invalid_argument ("Missing part num with -p option");

    *j = strtol (argv[i + 1], 0, 0);
    cout << "part number: " << *j << endl;
    i += 2;
}